

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int str_utf8_encode(char *ptr,int chr)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = (byte)chr;
  if (chr < 0x80) {
    *ptr = bVar2;
    return 1;
  }
  if ((uint)chr < 0x800) {
    *ptr = (byte)((uint)chr >> 6) | 0xc0;
    ptr[1] = bVar2 & 0x3f | 0x80;
    return 2;
  }
  if ((uint)chr < 0x10000) {
    *ptr = (byte)((uint)chr >> 0xc) | 0xe0;
    ptr[1] = (byte)((uint)chr >> 6) & 0x3f | 0x80;
    ptr[2] = bVar2 & 0x3f | 0x80;
    return 3;
  }
  iVar1 = 0;
  if ((uint)chr < 0x110000) {
    *ptr = (byte)((uint)chr >> 0x12) | 0xf0;
    ptr[1] = (byte)((uint)chr >> 0xc) & 0x3f | 0x80;
    ptr[2] = (byte)((uint)chr >> 6) & 0x3f | 0x80;
    ptr[3] = bVar2 & 0x3f | 0x80;
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int str_utf8_encode(char *ptr, int chr)
{
	/* encode */
	if(chr <= 0x7F)
	{
		ptr[0] = (char)chr;
		return 1;
	}
	else if(chr <= 0x7FF)
	{
		ptr[0] = 0xC0|((chr>>6)&0x1F);
		ptr[1] = 0x80|(chr&0x3F);
		return 2;
	}
	else if(chr <= 0xFFFF)
	{
		ptr[0] = 0xE0|((chr>>12)&0x0F);
		ptr[1] = 0x80|((chr>>6)&0x3F);
		ptr[2] = 0x80|(chr&0x3F);
		return 3;
	}
	else if(chr <= 0x10FFFF)
	{
		ptr[0] = 0xF0|((chr>>18)&0x07);
		ptr[1] = 0x80|((chr>>12)&0x3F);
		ptr[2] = 0x80|((chr>>6)&0x3F);
		ptr[3] = 0x80|(chr&0x3F);
		return 4;
	}

	return 0;
}